

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_include_free_(lysf_ctx *ctx,lysp_include *include,ly_bool main_module)

{
  undefined3 in_register_00000011;
  lysp_ext_instance *plVar1;
  long lVar2;
  lysp_ext_instance *plVar3;
  
  if ((CONCAT31(in_register_00000011,main_module) != 0) &&
     (include->submodule != (lysp_submodule *)0x0)) {
    lysp_module_free(ctx,(lysp_module *)include->submodule);
  }
  lydict_remove(ctx->ctx,include->name);
  lydict_remove(ctx->ctx,include->dsc);
  lydict_remove(ctx->ctx,include->ref);
  plVar1 = include->exts;
  if (plVar1 != (lysp_ext_instance *)0x0) {
    plVar3 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
      if (plVar1[-1].exts <= plVar3) {
        free(&plVar1[-1].exts);
        return;
      }
      plVar1 = (lysp_ext_instance *)((long)&plVar1->name + lVar2);
      lVar2 = lVar2 + 0x70;
      lysp_ext_instance_free(ctx,plVar1);
      plVar1 = include->exts;
    } while (plVar1 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysp_include_free_(struct lysf_ctx *ctx, struct lysp_include *include, ly_bool main_module)
{
    if (main_module && include->submodule) {
        lysp_module_free(ctx, (struct lysp_module *)include->submodule);
    }
    lydict_remove(ctx->ctx, include->name);
    lydict_remove(ctx->ctx, include->dsc);
    lydict_remove(ctx->ctx, include->ref);
    FREE_ARRAY(ctx, include->exts, lysp_ext_instance_free);
}